

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_types-c.cpp
# Opt level: O3

idx_t duckdb_struct_type_child_count(duckdb_logical_type type)

{
  optional_ptr<duckdb::ExtraTypeInfo,_true> oStack_10;
  
  if ((type != (duckdb_logical_type)0x0) && (type[1] == (_duckdb_logical_type)0x18)) {
    oStack_10.ptr = *(ExtraTypeInfo **)(type + 8);
    duckdb::optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid(&oStack_10);
    return (*(long *)&oStack_10.ptr[1].type - (long)oStack_10.ptr[1]._vptr_ExtraTypeInfo >> 3) *
           0x6db6db6db6db6db7;
  }
  return 0;
}

Assistant:

static bool AssertInternalType(duckdb_logical_type type, duckdb::PhysicalType physical_type) {
	if (!type) {
		return false;
	}
	auto &logical_type = *(reinterpret_cast<duckdb::LogicalType *>(type));
	if (logical_type.InternalType() != physical_type) {
		return false;
	}
	return true;
}